

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node_pair *
fy_node_mapping_pair_insert_prepare(fy_node *fyn_map,fy_node *fyn_key,fy_node *fyn_value)

{
  fy_document *fyd_00;
  _Bool _Var1;
  fy_node_pair *fynp;
  fy_document *fyd;
  fy_node *fyn_value_local;
  fy_node *fyn_key_local;
  fy_node *fyn_map_local;
  
  if ((fyn_map == (fy_node *)0x0) || ((fyn_map->field_0x34 & 3) != 2)) {
    fyn_map_local = (fy_node *)0x0;
  }
  else {
    fyd_00 = fyn_map->fyd;
    if (fyd_00 == (fy_document *)0x0) {
      fyn_map_local = (fy_node *)0x0;
    }
    else if (((fyn_key == (fy_node *)0x0) || (fyn_key->fyd == fyd_00)) &&
            ((fyn_value == (fy_node *)0x0 || (fyn_value->fyd == fyd_00)))) {
      if (((fyn_key == (fy_node *)0x0) || (((byte)fyn_key->field_0x34 >> 3 & 1) == 0)) &&
         ((fyn_value == (fy_node *)0x0 || (((byte)fyn_value->field_0x34 >> 3 & 1) == 0)))) {
        _Var1 = fy_node_mapping_key_is_duplicate(fyn_map,fyn_key);
        if (_Var1) {
          fyn_map_local = (fy_node *)0x0;
        }
        else {
          fyn_map_local = (fy_node *)fy_node_pair_alloc(fyd_00);
          if (fyn_map_local == (fy_node *)0x0) {
            fyn_map_local = (fy_node *)0x0;
          }
          else {
            if (fyn_key != (fy_node *)0x0) {
              fyn_key->parent = (fy_node *)0x0;
            }
            if (fyn_value != (fy_node *)0x0) {
              fyn_value->parent = fyn_map;
            }
            fyn_map_local->tag = (fy_token *)fyn_key;
            *(fy_node **)&fyn_map_local->style = fyn_value;
            fyn_map_local->fyd = (fy_document *)fyn_map;
          }
        }
      }
      else {
        fyn_map_local = (fy_node *)0x0;
      }
    }
    else {
      fyn_map_local = (fy_node *)0x0;
    }
  }
  return (fy_node_pair *)fyn_map_local;
}

Assistant:

static struct fy_node_pair *
fy_node_mapping_pair_insert_prepare(struct fy_node *fyn_map,
                                    struct fy_node *fyn_key, struct fy_node *fyn_value) {
    struct fy_document *fyd;
    struct fy_node_pair *fynp;

    if (!fyn_map || fyn_map->type != FYNT_MAPPING)
        return NULL;

    /* a document must be associated with the mapping */
    fyd = fyn_map->fyd;
    if (!fyd)
        return NULL;

    /* if not NULL, the documents of the nodes must match */
    if ((fyn_key && fyn_key->fyd != fyd) ||
        (fyn_value && fyn_value->fyd != fyd))
        return NULL;

    /* if not NULL neither the key nor the value must be attached */
    if ((fyn_key && fyn_key->attached) ||
        (fyn_value && fyn_value->attached))
        return NULL;

    if (fy_node_mapping_key_is_duplicate(fyn_map, fyn_key))
        return NULL;

    fynp = fy_node_pair_alloc(fyd);
    if (!fynp)
        return NULL;

    if (fyn_key)
        fyn_key->parent = NULL;
    if (fyn_value)
        fyn_value->parent = fyn_map;

    fynp->key = fyn_key;
    fynp->value = fyn_value;
    fynp->parent = fyn_map;

    return fynp;
}